

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

void __thiscall
amrex::CoordSys::HiFace
          (CoordSys *this,IntVect *point,int dir,Vector<double,_std::allocator<double>_> *loc)

{
  undefined4 in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  Real *in_stack_00000008;
  int in_stack_00000014;
  undefined4 in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::vector<double,_std::allocator<double>_>::resize
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  Vector<double,_std::allocator<double>_>::dataPtr
            ((Vector<double,_std::allocator<double>_> *)0x18b7a8d);
  HiFace((CoordSys *)CONCAT44(dir,in_stack_00000020),(IntVect *)loc,in_stack_00000014,
         in_stack_00000008);
  return;
}

Assistant:

void
CoordSys::HiFace (const IntVect& point,
                  int            dir,
                  Vector<Real>&   loc) const noexcept
{
    loc.resize(AMREX_SPACEDIM);
    HiFace(point,dir, loc.dataPtr());
}